

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void __thiscall player_t::Serialize(player_t *this,FSerializer *arc)

{
  bool bVar1;
  FSerializer *pFVar2;
  char *skinname_00;
  FString local_20;
  FString skinname;
  FSerializer *arc_local;
  player_t *this_local;
  
  skinname.Chars = (char *)arc;
  FString::FString(&local_20);
  pFVar2 = FSerializer::operator()((FSerializer *)skinname.Chars,"class",&this->cls);
  pFVar2 = FSerializer::operator()(pFVar2,"mo",&this->mo);
  pFVar2 = FSerializer::operator()(pFVar2,"camera",&this->camera);
  pFVar2 = FSerializer::operator()(pFVar2,"playerstate",&this->playerstate);
  FSerializer::operator()(pFVar2,"cmd",&this->cmd);
  bVar1 = FSerializer::isReading((FSerializer *)skinname.Chars);
  if (bVar1) {
    ReadUserInfo((FSerializer *)skinname.Chars,&this->userinfo,&local_20);
  }
  else {
    WriteUserInfo((FSerializer *)skinname.Chars,&this->userinfo);
  }
  pFVar2 = FSerializer::operator()((FSerializer *)skinname.Chars,"desiredfov",&this->DesiredFOV);
  pFVar2 = FSerializer::operator()(pFVar2,"fov",&this->FOV);
  pFVar2 = FSerializer::operator()(pFVar2,"viewz",&this->viewz);
  pFVar2 = FSerializer::operator()(pFVar2,"viewheight",&this->viewheight);
  pFVar2 = FSerializer::operator()(pFVar2,"deltaviewheight",&this->deltaviewheight);
  pFVar2 = FSerializer::operator()(pFVar2,"bob",&this->bob);
  pFVar2 = FSerializer::operator()(pFVar2,"vel",&this->Vel);
  pFVar2 = FSerializer::operator()(pFVar2,"centering",&this->centering);
  pFVar2 = FSerializer::operator()(pFVar2,"health",&this->health);
  pFVar2 = FSerializer::operator()(pFVar2,"inventorytics",&this->inventorytics);
  pFVar2 = FSerializer::operator()(pFVar2,"fragcount",&this->fragcount);
  pFVar2 = FSerializer::operator()(pFVar2,"spreecount",&this->spreecount);
  pFVar2 = FSerializer::operator()(pFVar2,"multicount",&this->multicount);
  pFVar2 = FSerializer::operator()(pFVar2,"lastkilltime",&this->lastkilltime);
  pFVar2 = FSerializer::operator()(pFVar2,"readyweapon",&this->ReadyWeapon);
  pFVar2 = FSerializer::operator()(pFVar2,"pendingweapon",&this->PendingWeapon);
  pFVar2 = FSerializer::operator()(pFVar2,"cheats",&this->cheats);
  pFVar2 = FSerializer::operator()(pFVar2,"refire",&this->refire);
  pFVar2 = FSerializer::operator()(pFVar2,"inconsistant",&this->inconsistant);
  pFVar2 = FSerializer::operator()(pFVar2,"killcount",&this->killcount);
  pFVar2 = FSerializer::operator()(pFVar2,"itemcount",&this->itemcount);
  pFVar2 = FSerializer::operator()(pFVar2,"secretcount",&this->secretcount);
  pFVar2 = FSerializer::operator()(pFVar2,"damagecount",&this->damagecount);
  pFVar2 = FSerializer::operator()(pFVar2,"bonuscount",&this->bonuscount);
  pFVar2 = FSerializer::operator()(pFVar2,"hazardcount",&this->hazardcount);
  pFVar2 = FSerializer::operator()(pFVar2,"poisoncount",&this->poisoncount);
  pFVar2 = FSerializer::operator()(pFVar2,"poisoner",&this->poisoner);
  pFVar2 = FSerializer::operator()(pFVar2,"attacker",&this->attacker);
  pFVar2 = FSerializer::operator()(pFVar2,"extralight",&this->extralight);
  pFVar2 = FSerializer::operator()(pFVar2,"fixedcolormap",&this->fixedcolormap);
  pFVar2 = FSerializer::operator()(pFVar2,"fixedlightlevel",&this->fixedlightlevel);
  pFVar2 = FSerializer::operator()(pFVar2,"morphTics",&this->morphTics);
  pFVar2 = FSerializer::operator()(pFVar2,"morphedplayerclass",&this->MorphedPlayerClass);
  pFVar2 = FSerializer::operator()(pFVar2,"morphstyle",&this->MorphStyle);
  pFVar2 = FSerializer::operator()(pFVar2,"morphexitflash",&this->MorphExitFlash);
  pFVar2 = FSerializer::operator()(pFVar2,"premorphweapon",&this->PremorphWeapon);
  pFVar2 = FSerializer::operator()(pFVar2,"chickenpeck",&this->chickenPeck);
  pFVar2 = FSerializer::operator()(pFVar2,"jumptics",&this->jumpTics);
  pFVar2 = FSerializer::operator()(pFVar2,"respawntime",&this->respawn_time);
  pFVar2 = FSerializer::operator()(pFVar2,"airfinished",&this->air_finished);
  pFVar2 = FSerializer::operator()(pFVar2,"turnticks",&this->turnticks);
  pFVar2 = FSerializer::operator()(pFVar2,"oldbuttons",&this->oldbuttons);
  pFVar2 = FSerializer::operator()(pFVar2,"hazardtype",&this->hazardtype);
  pFVar2 = FSerializer::operator()(pFVar2,"hazardinterval",&this->hazardinterval);
  pFVar2 = FSerializer::operator()(pFVar2,"bot",&this->Bot);
  pFVar2 = FSerializer::operator()(pFVar2,"blendr",&this->BlendR);
  pFVar2 = FSerializer::operator()(pFVar2,"blendg",&this->BlendG);
  pFVar2 = FSerializer::operator()(pFVar2,"blendb",&this->BlendB);
  pFVar2 = FSerializer::operator()(pFVar2,"blenda",&this->BlendA);
  pFVar2 = FSerializer::operator()(pFVar2,"weaponstate",&this->WeaponState);
  pFVar2 = FSerializer::operator()(pFVar2,"logtext",&this->LogText);
  pFVar2 = FSerializer::operator()(pFVar2,"conversionnpc",&this->ConversationNPC);
  pFVar2 = FSerializer::operator()(pFVar2,"conversionpc",&this->ConversationPC);
  pFVar2 = FSerializer::operator()(pFVar2,"conversionnpcangle",&this->ConversationNPCAngle);
  pFVar2 = FSerializer::operator()(pFVar2,"conversionfacetalker",&this->ConversationFaceTalker);
  pFVar2 = FSerializer::Array<int>(pFVar2,"frags",this->frags,8,false);
  pFVar2 = FSerializer::operator()(pFVar2,"psprites",&this->psprites);
  pFVar2 = FSerializer::operator()(pFVar2,"currentplayerclass",&this->CurrentPlayerClass);
  pFVar2 = FSerializer::operator()(pFVar2,"crouchfactor",&this->crouchfactor);
  pFVar2 = FSerializer::operator()(pFVar2,"crouching",&this->crouching);
  pFVar2 = FSerializer::operator()(pFVar2,"crouchdir",&this->crouchdir);
  pFVar2 = FSerializer::operator()(pFVar2,"crouchviewdelta",&this->crouchviewdelta);
  pFVar2 = FSerializer::operator()(pFVar2,"original_cmd",&this->original_cmd);
  pFVar2 = FSerializer::operator()(pFVar2,"original_oldbuttons",&this->original_oldbuttons);
  pFVar2 = FSerializer::operator()(pFVar2,"poisontype",&this->poisontype);
  pFVar2 = FSerializer::operator()(pFVar2,"poisonpaintype",&this->poisonpaintype);
  pFVar2 = FSerializer::operator()(pFVar2,"timefreezer",&this->timefreezer);
  pFVar2 = FSerializer::operator()(pFVar2,"settings_controller",&this->settings_controller);
  pFVar2 = FSerializer::operator()(pFVar2,"onground",&this->onground);
  pFVar2 = FSerializer::operator()(pFVar2,"musinfoactor",&this->MUSINFOactor);
  FSerializer::operator()(pFVar2,"musinfotics",&this->MUSINFOtics);
  bVar1 = FSerializer::isWriting((FSerializer *)skinname.Chars);
  if (bVar1) {
    this->oldbuttons = 0xffffffff;
    this->original_oldbuttons = 0xffffffff;
  }
  bVar1 = FString::IsNotEmpty(&local_20);
  if (bVar1) {
    skinname_00 = FString::operator_cast_to_char_(&local_20);
    userinfo_t::SkinChanged(&this->userinfo,skinname_00,(uint)this->CurrentPlayerClass);
  }
  FString::~FString(&local_20);
  return;
}

Assistant:

void player_t::Serialize(FSerializer &arc)
{
	FString skinname;

	arc("class", cls)
		("mo", mo)
		("camera", camera)
		("playerstate", playerstate)
		("cmd", cmd);

	if (arc.isReading())
	{
		ReadUserInfo(arc, userinfo, skinname);
	}
	else
	{
		WriteUserInfo(arc, userinfo);
	}

	arc("desiredfov", DesiredFOV)
		("fov", FOV)
		("viewz", viewz)
		("viewheight", viewheight)
		("deltaviewheight", deltaviewheight)
		("bob", bob)
		("vel", Vel)
		("centering", centering)
		("health", health)
		("inventorytics", inventorytics)
		("fragcount", fragcount)
		("spreecount", spreecount)
		("multicount", multicount)
		("lastkilltime", lastkilltime)
		("readyweapon", ReadyWeapon)
		("pendingweapon", PendingWeapon)
		("cheats", cheats)
		("refire", refire)
		("inconsistant", inconsistant)
		("killcount", killcount)
		("itemcount", itemcount)
		("secretcount", secretcount)
		("damagecount", damagecount)
		("bonuscount", bonuscount)
		("hazardcount", hazardcount)
		("poisoncount", poisoncount)
		("poisoner", poisoner)
		("attacker", attacker)
		("extralight", extralight)
		("fixedcolormap", fixedcolormap)
		("fixedlightlevel", fixedlightlevel)
		("morphTics", morphTics)
		("morphedplayerclass", MorphedPlayerClass)
		("morphstyle", MorphStyle)
		("morphexitflash", MorphExitFlash)
		("premorphweapon", PremorphWeapon)
		("chickenpeck", chickenPeck)
		("jumptics", jumpTics)
		("respawntime", respawn_time)
		("airfinished", air_finished)
		("turnticks", turnticks)
		("oldbuttons", oldbuttons)
		("hazardtype", hazardtype)
		("hazardinterval", hazardinterval)
		("bot", Bot)
		("blendr", BlendR)
		("blendg", BlendG)
		("blendb", BlendB)
		("blenda", BlendA)
		("weaponstate", WeaponState)
		("logtext", LogText)
		("conversionnpc", ConversationNPC)
		("conversionpc", ConversationPC)
		("conversionnpcangle", ConversationNPCAngle)
		("conversionfacetalker", ConversationFaceTalker)
		.Array("frags", frags, MAXPLAYERS)
		("psprites", psprites)
		("currentplayerclass", CurrentPlayerClass)
		("crouchfactor", crouchfactor)
		("crouching", crouching)
		("crouchdir", crouchdir)
		("crouchviewdelta", crouchviewdelta)
		("original_cmd", original_cmd)
		("original_oldbuttons", original_oldbuttons)
		("poisontype", poisontype)
		("poisonpaintype", poisonpaintype)
		("timefreezer", timefreezer)
		("settings_controller", settings_controller)
		("onground", onground)
		("musinfoactor", MUSINFOactor)
		("musinfotics", MUSINFOtics);

	if (arc.isWriting ())
	{
		// If the player reloaded because they pressed +use after dying, we
		// don't want +use to still be down after the game is loaded.
		oldbuttons = ~0;
		original_oldbuttons = ~0;
	}
	if (skinname.IsNotEmpty())
	{
		userinfo.SkinChanged(skinname, CurrentPlayerClass);
	}
}